

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall
wabt::TypeChecker::EndTryTable(TypeChecker *this,TypeVector *param_types,TypeVector *result_types)

{
  PushLabel(this,TryTable,param_types,result_types);
  PushTypes(this,param_types);
  return (Result)Ok;
}

Assistant:

Result TypeChecker::EndTryTable(const TypeVector& param_types,
                                const TypeVector& result_types) {
  PushLabel(LabelType::TryTable, param_types, result_types);
  PushTypes(param_types);
  return Result::Ok;
}